

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSPI.cpp
# Opt level: O2

void __thiscall
wasm::JSPI::makeWrapperForImport
          (JSPI *this,Function *im,Module *module,Name suspender,bool wasmSplit)

{
  HeapType *this_00;
  ExpressionList *this_01;
  uintptr_t uVar1;
  char *pcVar2;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar3;
  char *pcVar4;
  Module *this_02;
  Builder func;
  Call *value;
  GlobalGet *pGVar5;
  Type *__x;
  LocalGet *pLVar6;
  Block *this_03;
  LocalSet *item;
  Call *item_00;
  GlobalSet *item_01;
  Type TVar7;
  Type *pTVar8;
  char *pcVar9;
  Index IVar10;
  string_view sVar11;
  Signature SVar12;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar13;
  Name name;
  optional<wasm::Type> type_;
  Name name_00;
  string_view local_120;
  string local_110;
  undefined1 local_ec [12];
  HeapType *local_e0;
  undefined1 auStack_d8 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> params;
  Name local_a8;
  size_t local_98;
  Module *local_90;
  undefined1 auStack_88 [8];
  Iterator __begin2;
  Index local_60;
  _Head_base<0UL,_wasm::Function_*,_false> local_48;
  __single_object wrapperIm;
  Builder builder;
  __single_object stub;
  
  pcVar9 = suspender.super_IString.str._M_str;
  local_98 = suspender.super_IString.str._M_len;
  wrapperIm._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)module;
  std::make_unique<wasm::Function>();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_d8,"import$",(allocator<char> *)&builder);
  local_a8.super_IString.str._M_str = (char *)im;
  IString::toString_abi_cxx11_(&local_110,(IString *)im);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_d8,
                 &local_110);
  IString::IString((IString *)&local_120,(string *)auStack_88);
  sVar11 = (string_view)Names::getValidFunctionName(module,(Name)local_120);
  ((local_48._M_head_impl)->super_Importable).super_Named.name.super_IString.str = sVar11;
  std::__cxx11::string::~string((string *)auStack_88);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)auStack_d8);
  pcVar4 = local_a8.super_IString.str._M_str;
  pcVar2 = (((Importable *)local_a8.super_IString.str._M_str)->module).super_IString.str._M_str;
  ((local_48._M_head_impl)->super_Importable).module.super_IString.str._M_len =
       (((Importable *)local_a8.super_IString.str._M_str)->module).super_IString.str._M_len;
  ((local_48._M_head_impl)->super_Importable).module.super_IString.str._M_str = pcVar2;
  pcVar2 = (((Importable *)local_a8.super_IString.str._M_str)->base).super_IString.str._M_str;
  ((local_48._M_head_impl)->super_Importable).base.super_IString.str._M_len =
       (((Importable *)local_a8.super_IString.str._M_str)->base).super_IString.str._M_len;
  ((local_48._M_head_impl)->super_Importable).base.super_IString.str._M_str = pcVar2;
  std::make_unique<wasm::Function>();
  Name::Name((Name *)auStack_88,(((Importable *)pcVar4)->super_Named).name.super_IString.str);
  ((builder.wasm)->exports).
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_88;
  ((builder.wasm)->exports).
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
  ((builder.wasm)->globals).
  super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)((HeapType *)((long)pcVar4 + 0x38))->id;
  local_90 = module;
  value = MixedArena::alloc<wasm::Call>(&module->allocator);
  pcVar2 = ((local_48._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str;
  (value->target).super_IString.str._M_len =
       ((local_48._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len;
  (value->target).super_IString.str._M_str = pcVar2;
  auStack_d8 = (undefined1  [8])0x0;
  params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  pTVar8 = &this->externref;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_d8,pTVar8);
  uVar1 = pTVar8->id;
  pGVar5 = MixedArena::alloc<wasm::GlobalGet>
                     ((MixedArena *)
                      ((long)wrapperIm._M_t.
                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200));
  (pGVar5->name).super_IString.str._M_len = local_98;
  (pGVar5->name).super_IString.str._M_str = pcVar9;
  (pGVar5->super_SpecificExpression<(wasm::Expression::Id)10>).super_Expression.type.id = uVar1;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&(value->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)pGVar5);
  this_00 = (HeapType *)((long)local_a8.super_IString.str._M_str + 0x38);
  SVar12 = HeapType::getSignature(this_00);
  local_110._M_dataplus._M_p = (pointer)SVar12.params.id;
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  local_e0 = this_00;
  auStack_88 = (undefined1  [8])&local_110;
  PVar13 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
           wasm::Type::end((Type *)&local_110);
  local_60 = (Index)PVar13.parent;
  IVar10 = 0;
  for (; PVar3.index = (size_t)__begin2.
                               super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent, PVar3.parent = (Type *)auStack_88, PVar13 != PVar3;
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)((long)&(__begin2.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                           parent)->id + 1)) {
    __x = wasm::Type::Iterator::operator*((Iterator *)auStack_88);
    uVar1 = __x->id;
    pLVar6 = MixedArena::alloc<wasm::LocalGet>
                       ((MixedArena *)
                        ((long)wrapperIm._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200)
                       );
    pLVar6->index = IVar10;
    (pLVar6->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = uVar1;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(value->operands).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)pLVar6);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_d8,__x);
    IVar10 = IVar10 + 1;
  }
  this_03 = MixedArena::alloc<wasm::Block>
                      ((MixedArena *)
                       ((long)wrapperIm._M_t.
                              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                              .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200))
  ;
  IVar10 = Builder::addVar((Function *)builder.wasm,(Type)pTVar8->id);
  SVar12 = HeapType::getSignature
                     ((HeapType *)
                      &((builder.wasm)->globals).
                       super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  func = builder;
  TVar7 = SVar12.results.id;
  if (1 < TVar7.id) {
    SVar12 = HeapType::getSignature
                       ((HeapType *)
                        &((builder.wasm)->globals).
                         super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    local_60 = Builder::addVar((Function *)func.wasm,SVar12.results.id);
  }
  uVar1 = pTVar8->id;
  pGVar5 = MixedArena::alloc<wasm::GlobalGet>
                     ((MixedArena *)
                      ((long)wrapperIm._M_t.
                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200));
  (pGVar5->name).super_IString.str._M_len = local_98;
  (pGVar5->name).super_IString.str._M_str = pcVar9;
  (pGVar5->super_SpecificExpression<(wasm::Expression::Id)10>).super_Expression.type.id = uVar1;
  item = Builder::makeLocalSet((Builder *)&wrapperIm,IVar10,(Expression *)pGVar5);
  this_01 = &this_03->list;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&this_01->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)item);
  item_00 = value;
  if (1 < TVar7.id) {
    item_00 = (Call *)Builder::makeLocalSet((Builder *)&wrapperIm,local_60,(Expression *)value);
  }
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&this_01->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)item_00);
  uVar1 = pTVar8->id;
  pLVar6 = MixedArena::alloc<wasm::LocalGet>
                     ((MixedArena *)
                      ((long)wrapperIm._M_t.
                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200));
  pLVar6->index = IVar10;
  (pLVar6->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = uVar1;
  name.super_IString.str._M_str = pcVar9;
  name.super_IString.str._M_len = local_98;
  item_01 = Builder::makeGlobalSet((Builder *)&wrapperIm,name,(Expression *)pLVar6);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&this_01->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)item_01);
  if (1 < TVar7.id) {
    SVar12 = HeapType::getSignature
                       ((HeapType *)
                        &((builder.wasm)->globals).
                         super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    item_01 = (GlobalSet *)
              MixedArena::alloc<wasm::LocalGet>
                        ((MixedArena *)
                         ((long)wrapperIm._M_t.
                                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200
                         ));
    *(Index *)&(item_01->name).super_IString.str._M_len = local_60;
    (item_01->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id =
         SVar12.results.id.id;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_01->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)item_01);
  }
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)item_01;
  Block::finalize(this_03,type_,Unknown);
  SVar12 = HeapType::getSignature(local_e0);
  (value->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id =
       SVar12.results.id.id;
  ((builder.wasm)->elementSegments).
  super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)this_03;
  wasm::Type::Type((Type *)(local_ec + 4),(Tuple *)auStack_d8);
  pcVar2 = local_a8.super_IString.str._M_str;
  SVar12.results.id =
       (value->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id;
  SVar12.params.id = local_ec._4_8_;
  HeapType::HeapType((HeapType *)auStack_88,SVar12);
  this_02 = local_90;
  ((local_48._M_head_impl)->type).id = (uintptr_t)auStack_88;
  pTVar8 = (Type *)(((Importable *)pcVar2)->super_Named).name.super_IString.str._M_str;
  if ((wasmSplit) && (pTVar8 == DAT_01175b10)) {
    auStack_88 = (undefined1  [8])ModuleSplitting::LOAD_SECONDARY_MODULE;
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         DAT_01175b10;
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index._0_1_ = 0;
    local_110._M_dataplus._M_p = (pointer)ModuleSplitting::LOAD_SECONDARY_MODULE;
    local_110._M_string_length = (size_type)DAT_01175b10;
    local_ec._0_4_ = 0;
    std::
    make_unique<wasm::Export,wasm::Name&,wasm::ExternalKind&,std::variant<wasm::Name,wasm::HeapType>&>
              (&local_a8,(ExternalKind *)&local_110,(variant<wasm::Name,_wasm::HeapType> *)local_ec)
    ;
    Module::addExport(this_02,(unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
                              &local_a8);
    std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
              ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)&local_a8);
    pTVar8 = (Type *)(((Importable *)pcVar2)->super_Named).name.super_IString.str._M_str;
  }
  name_00.super_IString.str._M_str = (char *)pTVar8;
  name_00.super_IString.str._M_len =
       (((Importable *)pcVar2)->super_Named).name.super_IString.str._M_len;
  Module::removeFunction(this_02,name_00);
  Module::addFunction(local_90,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                               &builder);
  Module::addFunction(local_90,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                               &local_48);
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
            ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_d8);
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
            ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&builder);
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
            ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&local_48);
  return;
}

Assistant:

void makeWrapperForImport(Function* im,
                            Module* module,
                            Name suspender,
                            bool wasmSplit) {
    Builder builder(*module);
    auto wrapperIm = std::make_unique<Function>();
    wrapperIm->name = Names::getValidFunctionName(
      *module, std::string("import$") + im->name.toString());
    wrapperIm->module = im->module;
    wrapperIm->base = im->base;
    auto stub = std::make_unique<Function>();
    stub->name = Name(im->name.str);
    stub->type = im->type;

    auto* call = module->allocator.alloc<Call>();
    call->target = wrapperIm->name;

    // Add an externref as the first argument to the imported function.
    std::vector<Type> params;
    params.push_back(externref);
    call->operands.push_back(builder.makeGlobalGet(suspender, externref));
    Index i = 0;
    for (const auto& param : im->getParams()) {
      call->operands.push_back(builder.makeLocalGet(i, param));
      params.push_back(param);
      ++i;
    }
    auto* block = builder.makeBlock();
    // Store the suspender so it can be restored after the call in case it is
    // modified by another entry into a Wasm export.
    auto supsenderCopyIndex = Builder::addVar(stub.get(), externref);
    // If there's a return value we need to store it so it can be returned
    // after restoring the suspender.
    std::optional<Index> returnIndex;
    if (stub->getResults().isConcrete()) {
      returnIndex = Builder::addVar(stub.get(), stub->getResults());
    }
    block->list.push_back(builder.makeLocalSet(
      supsenderCopyIndex, builder.makeGlobalGet(suspender, externref)));
    if (returnIndex) {
      block->list.push_back(builder.makeLocalSet(*returnIndex, call));
    } else {
      block->list.push_back(call);
    }
    // Restore the suspender.
    block->list.push_back(builder.makeGlobalSet(
      suspender, builder.makeLocalGet(supsenderCopyIndex, externref)));
    if (returnIndex) {
      block->list.push_back(
        builder.makeLocalGet(*returnIndex, stub->getResults()));
    }
    block->finalize();
    call->type = im->getResults();
    stub->body = block;
    wrapperIm->type = Signature(Type(params), call->type);

    if (wasmSplit && im->name == ModuleSplitting::LOAD_SECONDARY_MODULE) {
      // In non-debug builds the name of the JSPI wrapper function for loading
      // the secondary module will be removed. Create an export of it so that
      // wasm-split can find it.
      module->addExport(
        builder.makeExport(ModuleSplitting::LOAD_SECONDARY_MODULE,
                           ModuleSplitting::LOAD_SECONDARY_MODULE,
                           ExternalKind::Function));
    }
    module->removeFunction(im->name);
    module->addFunction(std::move(stub));
    module->addFunction(std::move(wrapperIm));
  }